

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

int64_t __thiscall
aeron::archive::AeronArchive::callAndPollForDescriptors
          (AeronArchive *this,function<bool_(long)> *f,int32_t recordCount,
          RecordingDescriptorConsumer *consumer,char *request)

{
  char *pcVar1;
  pointer correlationId;
  index_t index;
  element_type *peVar2;
  AtomicBuffer *this_00;
  bool bVar3;
  int64_t iVar4;
  SourcedException *this_01;
  long *plVar5;
  char *pcVar6;
  size_type *psVar7;
  char *pcVar8;
  unique_lock<std::mutex> lock;
  allocator local_ca;
  allocator local_c9;
  string local_c8;
  char *local_a8;
  string local_a0 [32];
  unique_lock<std::mutex> local_80;
  string local_70;
  string local_50;
  
  local_80._M_device = &this->lock_;
  local_80._M_owns = false;
  local_a8 = request;
  std::unique_lock<std::mutex>::lock(&local_80);
  local_80._M_owns = true;
  peVar2 = (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar2->m_toDriverRingBuffer).m_buffer;
  index = (peVar2->m_toDriverRingBuffer).m_correlationIdCounterIndex;
  concurrent::AtomicBuffer::boundsCheck(this_00,index,8);
  LOCK();
  plVar5 = (long *)(this_00->m_buffer + index);
  correlationId = (pointer)*plVar5;
  *plVar5 = *plVar5 + 1;
  UNLOCK();
  local_c8._M_dataplus._M_p = correlationId;
  if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  bVar3 = (*f->_M_invoker)((_Any_data *)f,(long *)&local_c8);
  if (bVar3) {
    iVar4 = pollForDescriptors(this,(int64_t)correlationId,recordCount,consumer);
    std::unique_lock<std::mutex>::~unique_lock(&local_80);
    return iVar4;
  }
  this_01 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string(local_a0,local_a8,&local_c9);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_a0);
  local_c8._M_dataplus._M_p = (pointer)*plVar5;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_c8._M_dataplus._M_p == psVar7) {
    local_c8.field_2._M_allocated_capacity = *psVar7;
    local_c8.field_2._8_4_ = (undefined4)plVar5[3];
    local_c8.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar7;
  }
  local_c8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "std::int64_t aeron::archive::AeronArchive::callAndPollForDescriptors(std::function<bool (std::int64_t)> &&, std::int32_t, RecordingDescriptorConsumer &&, const char *)"
             ,"");
  pcVar8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
  ;
  pcVar6 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
  do {
    pcVar6 = pcVar6 + 1;
    pcVar1 = pcVar8 + 1;
    pcVar8 = pcVar8 + 1;
  } while (*pcVar6 == *pcVar1);
  std::__cxx11::string::string((string *)&local_50,pcVar8 + (*pcVar1 == '/'),&local_ca);
  aeron::util::SourcedException::SourcedException(this_01,&local_c8,&local_70,&local_50,0x1ce);
  *(undefined ***)this_01 = &PTR__SourcedException_001642b8;
  __cxa_throw(this_01,&ArchiveException::typeinfo,aeron::util::SourcedException::~SourcedException);
}

Assistant:

std::int64_t AeronArchive::callAndPollForDescriptors(std::function<bool(std::int64_t)>&& f, std::int32_t recordCount,
                                                     RecordingDescriptorConsumer&& consumer, const char* request) {
    std::unique_lock<std::mutex> lock(lock_);

    std::int64_t correlationId = aeron_->nextCorrelationId();

    if (!f(correlationId)) {
        throw ArchiveException(std::string(request) + ": failed to send", SOURCEINFO);
    }

    return pollForDescriptors(correlationId, recordCount, std::move(consumer));
}